

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QDBusUnixFileDescriptor>::relocate
          (QArrayDataPointer<QDBusUnixFileDescriptor> *this,qsizetype offset,
          QDBusUnixFileDescriptor **data)

{
  bool bVar1;
  QDBusUnixFileDescriptor *first;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QDBusUnixFileDescriptor> *in_RDI;
  QDBusUnixFileDescriptor **unaff_retaddr;
  QDBusUnixFileDescriptor *res;
  QArrayDataPointer<QDBusUnixFileDescriptor> *c;
  
  first = in_RDI->ptr + in_RSI * 8;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QDBusUnixFileDescriptor,long_long>
            (first,(longlong)in_RDI,(QDBusUnixFileDescriptor *)0xad34b7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QDBusUnixFileDescriptor>,QDBusUnixFileDescriptor_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }